

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

int Pdr_ManSolve(Aig_Man_t *pAig,Pdr_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Pdr_Man_t *p;
  Vec_Int_t *pVVar5;
  Vec_Str_t *vStr;
  abctime aVar6;
  char *pcVar7;
  char *pcVar8;
  Aig_Man_t *pAVar9;
  char *pcVar10;
  
  pAVar9 = pAig;
  aVar4 = Abc_Clock();
  iVar2 = (int)pAVar9;
  if (pPars->nTimeOutOne != 0) {
    if (pPars->fSolveAll == 0) {
      pPars->nTimeOutOne = 0;
    }
    else if (pPars->nTimeOut == 0) {
      iVar1 = pPars->nTimeOutOne * pAig->nTruePos;
      pPars->nTimeOut = (uint)(0 < iVar1 % 1000) + iVar1 / 1000;
    }
  }
  if (pPars->fVerbose != 0) {
    Abc_Print(iVar2,"VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
              (ulong)(uint)pPars->nRecycle,(ulong)(uint)pPars->nFrameMax,
              (ulong)(uint)pPars->nRestLimit,(ulong)(uint)pPars->nTimeOut);
    pcVar10 = "yes";
    pcVar8 = "yes";
    if (pPars->fMonoCnf == 0) {
      pcVar8 = "no";
    }
    pcVar7 = "yes";
    if (pPars->fSkipGeneral == 0) {
      pcVar7 = "no";
    }
    if (pPars->fSolveAll == 0) {
      pcVar10 = "no";
    }
    Abc_Print(iVar2,"MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",pcVar8,pcVar7,pcVar10);
  }
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  p = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  iVar2 = Pdr_ManSolveInt(p);
  if (((iVar2 == 0) && (pAig->pSeqModel == (Abc_Cex_t *)0x0)) && (p->vCexes == (Vec_Ptr_t *)0x0)) {
    __assert_fail("pAig->pSeqModel != NULL || p->vCexes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrCore.c"
                  ,0x393,"int Pdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrCore.c"
                    ,0x396,"int Pdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  if (p->pPars->fDumpInv != 0) {
    pVVar5 = Pdr_ManDeriveInfinityClauses(p,(uint)(iVar2 != 1));
    Abc_FrameSetCnf(pVVar5);
    vStr = Pdr_ManDumpString(p);
    Abc_FrameSetStr(vStr);
    pVVar5 = Pdr_ManCountFlopsInv(p);
    Abc_FrameSetInv(pVVar5);
    Pdr_ManDumpClauses(p,"inv.pla",(uint)(iVar2 == 1));
  }
  aVar6 = Abc_Clock();
  p->tTotal = p->tTotal + (aVar6 - aVar4);
  Pdr_ManStop(p);
  pPars->iFrame = pPars->iFrame + -1;
  if (pPars->vOutMap != (Vec_Int_t *)0x0) {
    for (iVar1 = 0; iVar1 < pAig->nTruePos; iVar1 = iVar1 + 1) {
      iVar3 = Vec_IntEntry(pPars->vOutMap,iVar1);
      if (iVar3 == -2) {
        Vec_IntWriteEntry(pPars->vOutMap,iVar1,-1);
      }
    }
  }
  if (pPars->fUseBridge != 0) {
    Gia_ManToBridgeAbort(_stdout,7,(uchar *)"timeout");
  }
  return iVar2;
}

Assistant:

int Pdr_ManSolve( Aig_Man_t * pAig, Pdr_Par_t * pPars )
{
    Pdr_Man_t * p;
    int k, RetValue;
    abctime clk = Abc_Clock();
    if ( pPars->nTimeOutOne && !pPars->fSolveAll )
        pPars->nTimeOutOne = 0;
    if ( pPars->nTimeOutOne && pPars->nTimeOut == 0 )
        pPars->nTimeOut = pPars->nTimeOutOne * Saig_ManPoNum(pAig) / 1000 + (int)((pPars->nTimeOutOne * Saig_ManPoNum(pAig) % 1000) > 0);
    if ( pPars->fVerbose )
    {
//    Abc_Print( 1, "Running PDR by Niklas Een (aka IC3 by Aaron Bradley) with these parameters:\n" );
        Abc_Print( 1, "VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
            pPars->nRecycle,
            pPars->nFrameMax,
            pPars->nRestLimit,
            pPars->nTimeOut );
        Abc_Print( 1, "MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",
            pPars->fMonoCnf ?     "yes" : "no",
            pPars->fSkipGeneral ? "yes" : "no",
            pPars->fSolveAll ?    "yes" : "no" );
    }
    ABC_FREE( pAig->pSeqModel );
    p = Pdr_ManStart( pAig, pPars, NULL );
    RetValue = Pdr_ManSolveInt( p );
    if ( RetValue == 0 )
        assert( pAig->pSeqModel != NULL || p->vCexes != NULL );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
    if ( p->pPars->fDumpInv )
    {
        Abc_FrameSetCnf( Pdr_ManDeriveInfinityClauses( p, RetValue!=1 ) );
        Abc_FrameSetStr( Pdr_ManDumpString(p) );
        Abc_FrameSetInv( Pdr_ManCountFlopsInv(p) );
        Pdr_ManDumpClauses( p, (char *)"inv.pla", RetValue==1 );
    }
    p->tTotal += Abc_Clock() - clk;
    Pdr_ManStop( p );
    pPars->iFrame--;
    // convert all -2 (unknown) entries into -1 (undec)
    if ( pPars->vOutMap )
        for ( k = 0; k < Saig_ManPoNum(pAig); k++ )
            if ( Vec_IntEntry(pPars->vOutMap, k) == -2 ) // unknown
                Vec_IntWriteEntry( pPars->vOutMap, k, -1 ); // undec
    if ( pPars->fUseBridge )
        Gia_ManToBridgeAbort( stdout, 7, (unsigned char *)"timeout" );
    return RetValue;
}